

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic.cpp
# Opt level: O0

void __thiscall Logic::Run(Logic *this,QLearning *q,int *r)

{
  int iVar1;
  int iVar2;
  initializer_list<int> __l;
  byte bVar3;
  int iVar4;
  reference pvVar5;
  time_t tVar6;
  mapped_type *pmVar7;
  ostream *poVar8;
  iterator iVar9;
  iterator iVar10;
  iterator iVar11;
  back_insert_iterator<std::vector<int,_std::allocator<int>_>_> bVar12;
  iterator __first;
  iterator __last;
  reference pvVar13;
  float fVar14;
  allocator local_319;
  string local_318 [32];
  _InputArray local_2f8;
  allocator local_2d9;
  string local_2d8 [32];
  Scalar_<double> local_2b8;
  Point_<int> local_298;
  _InputOutputArray local_290;
  Point_<int> local_278;
  Point p1;
  Point_<int> local_250;
  _InputOutputArray local_248;
  Size_<int> local_230;
  _OutputArray local_228;
  _InputArray local_210;
  Scalar_<double> local_1f8;
  Mat local_1d8 [8];
  Mat Picture;
  float ep;
  exception *er_3;
  float new_q_1;
  float new_q;
  exception *er_2;
  float current_q_1;
  float current_q;
  exception *er_1;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_130;
  iterator max_future_q;
  exception *er;
  vector<float,_std::allocator<float>_> max_future;
  undefined1 local_d8 [8];
  vector<int,_std::allocator<int>_> new_obs;
  double reward;
  undefined1 local_a0 [8];
  vector<float,_std::allocator<float>_> vec;
  int i_1;
  int local_78;
  int local_74;
  iterator local_70;
  undefined8 local_68;
  int local_5c;
  undefined1 local_58 [4];
  int j;
  vector<int,_std::allocator<int>_> player_pos;
  double episode_reward;
  int local_30;
  Player p;
  int i;
  int *r_local;
  QLearning *q_local;
  Logic *this_local;
  
  p.z = 0;
  unique0x10000b04 = r;
  do {
    if (4999 < p.z) {
      return;
    }
    Player::Player((Player *)((long)&episode_reward + 4),*stack0xffffffffffffffe0);
    player_pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_58);
    for (local_5c = 0; local_5c < 200; local_5c = local_5c + 1) {
      local_78 = episode_reward._4_4_;
      local_74 = local_30;
      local_70 = &local_78;
      local_68 = 2;
      __l._M_len = 2;
      __l._M_array = local_70;
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)local_58,__l);
      for (vec.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._0_4_ = 0;
          (int)vec.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage < 2;
          vec.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ =
               (int)vec.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::at
                           ((vector<int,_std::allocator<int>_> *)local_58,
                            (long)(int)vec.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                       .super__Vector_impl_data._M_end_of_storage);
        iVar4 = *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::at
                           (&Player::_goal,
                            (long)(int)vec.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                       .super__Vector_impl_data._M_end_of_storage);
        iVar1 = *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->_observations,
                            (long)(int)vec.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                       .super__Vector_impl_data._M_end_of_storage);
        *pvVar5 = iVar4 - iVar1;
      }
      tVar6 = time((time_t *)0x0);
      srand((uint)tVar6);
      iVar4 = rand();
      fVar14 = QLearning::GetEpsilon(q);
      if ((float)iVar4 / 2.1474836e+09 <= fVar14) {
        iVar4 = rand();
        this->_action = iVar4 % q->_actionSize;
      }
      else {
        pmVar7 = std::
                 map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                 ::operator[](&q->_q_table,&this->_observations);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)local_a0,pmVar7);
        iVar4 = arg_max<float,std::allocator<float>>
                          (this,(vector<float,_std::allocator<float>_> *)local_a0);
        this->_action = iVar4;
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)local_a0);
      }
      Player::action((vector<int,_std::allocator<int>_> *)&reward,
                     (Player *)((long)&episode_reward + 4),this->_action);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)local_58,
                 (vector<int,_std::allocator<int>_> *)&reward);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&reward);
      pvVar5 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)local_58,0);
      iVar4 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::at(&Player::_goal,0);
      iVar1 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)local_58,1);
      iVar2 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::at(&Player::_goal,1);
      new_obs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)(1.0 / ((double)((iVar4 - iVar1) + (iVar2 - *pvVar5)) + 0.001));
      pvVar5 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)local_58,0);
      iVar4 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::at(&Player::_goal,0);
      if (iVar4 == *pvVar5) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::at
                           ((vector<int,_std::allocator<int>_> *)local_58,1);
        iVar4 = *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::at(&Player::_goal,1);
        if (iVar4 == *pvVar5) {
          poVar8 = std::operator<<((ostream *)&std::cout,"Goal reached");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          break;
        }
      }
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_d8);
      iVar9 = std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_58);
      iVar10 = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_58);
      iVar11 = std::vector<int,_std::allocator<int>_>::begin(&Player::_goal);
      bVar12 = std::back_inserter<std::vector<int,std::allocator<int>>>
                         ((vector<int,_std::allocator<int>_> *)local_d8);
      max_future.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)std::
                    transform<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::back_insert_iterator<std::vector<int,std::allocator<int>>>,std::minus<int>>
                              (iVar9._M_current,iVar10._M_current,iVar11._M_current,bVar12.container
                              );
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&er);
      pmVar7 = std::
               map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
               ::operator[](&q->_q_table,(key_type *)local_d8);
      std::vector<float,_std::allocator<float>_>::operator=
                ((vector<float,_std::allocator<float>_> *)&er,pmVar7);
      __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
      __normal_iterator(&local_130);
      __first = std::begin<std::vector<float,std::allocator<float>>>
                          ((vector<float,_std::allocator<float>_> *)&er);
      __last = std::end<std::vector<float,std::allocator<float>>>
                         ((vector<float,_std::allocator<float>_> *)&er);
      local_130 = std::
                  max_element<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                            (__first._M_current,__last._M_current);
      pmVar7 = std::
               map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
               ::operator[](&q->_q_table,&this->_observations);
      std::vector<float,_std::allocator<float>_>::operator[](pmVar7,(long)this->_action);
      __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator*
                (&local_130);
      pmVar7 = std::
               map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
               ::operator[](&q->_q_table,&this->_observations);
      pvVar13 = std::vector<float,_std::allocator<float>_>::operator[](pmVar7,(long)this->_action);
      *pvVar13 = er_3._4_4_;
      player_pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((double)new_obs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage +
                    (double)player_pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)&er);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_d8)
      ;
    }
    fVar14 = QLearning::GetEpsilon(q);
    poVar8 = std::operator<<((ostream *)&std::cout,"#----------------------");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,p.z);
    poVar8 = std::operator<<(poVar8," Episode Reward: ");
    poVar8 = (ostream *)
             std::ostream::operator<<
                       (poVar8,(double)player_pos.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    QLearning::SetEpsilon(q,fVar14 * QLearning::_EPS_DECAY);
    cv::Scalar_<double>::Scalar_(&local_1f8,0.0,0.0,0.0,0.0);
    cv::Mat::Mat(local_1d8,0x140,0xf0,0x10,(Scalar_ *)&local_1f8);
    bVar3 = cv::Mat::empty();
    if ((bVar3 & 1) != 0) {
      poVar8 = std::operator<<((ostream *)&std::cout,"Could not instantiate the image");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      std::istream::get();
    }
    cv::_InputArray::_InputArray(&local_210,local_1d8);
    cv::_OutputArray::_OutputArray(&local_228,local_1d8);
    cv::Size_<int>::Size_(&local_230,500,500);
    cv::resize(0,&local_210,&local_228,&local_230,1);
    cv::_OutputArray::~_OutputArray(&local_228);
    cv::_InputArray::~_InputArray(&local_210);
    cv::_InputOutputArray::_InputOutputArray(&local_248,local_1d8);
    pvVar5 = std::vector<int,_std::allocator<int>_>::at(&Player::_goal,0);
    iVar4 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::at(&Player::_goal,1);
    cv::Point_<int>::Point_(&local_250,iVar4 * 0x14,*pvVar5 * 0x14);
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)&p1,0.0,255.0,0.0,0.0);
    cv::circle(&local_248,&local_250,0x14,&p1,2,8,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_248);
    cv::Point_<int>::Point_(&local_278,episode_reward._4_4_ * 0x14,local_30 * 0x14);
    cv::_InputOutputArray::_InputOutputArray(&local_290,local_1d8);
    cv::Point_<int>::Point_(&local_298,&local_278);
    cv::Scalar_<double>::Scalar_(&local_2b8,255.0,0.0,255.0,0.0);
    cv::circle(&local_290,&local_298,0x14,&local_2b8,0xfffffffe,8,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_290);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d8,"Path planner Reinforcement-Learning",&local_2d9);
    cv::_InputArray::_InputArray(&local_2f8,local_1d8);
    cv::imshow(local_2d8,&local_2f8);
    cv::_InputArray::~_InputArray(&local_2f8);
    std::__cxx11::string::~string(local_2d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
    cv::waitKey(10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_318,"Path planner Reinforcement-Learning",&local_319);
    cv::destroyWindow(local_318);
    std::__cxx11::string::~string(local_318);
    std::allocator<char>::~allocator((allocator<char> *)&local_319);
    cv::Mat::~Mat(local_1d8);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_58);
    p.z = p.z + 1;
  } while( true );
}

Assistant:

void Logic::Run(QLearning &q, const int &r)
{

    //int k = erl::QLearning::_EPISODES;

    for (int i = 0; i < 5000; i++)
    {
        Player p(r);
        double episode_reward = 0;
        std::vector<int> player_pos;

        for (int j = 0; j < 200; j++)
        {
            player_pos = {p.x, p.y};
            //std::cout << "Previous position " << p.x << " " << p.y << std::endl;
            // std::transform(player_pos.begin(),player_pos.end(),(p.GetGoal()).begin(), std::back_inserter(_observations),std::minus<int>()); //to be completed
            for (int i = 0; i < 2; i++)
            {
                _observations[i] = player_pos.at(i) - Player::_goal.at(i);
            }
            //std::cout<<"Observation<<"<<_observations[0]<< " "<<_observations[1]<<" " <<_observations[2]<<std::endl;
            //
            srand((unsigned)time(NULL));
            //std::cout<<q.GetEpsilon()<<std::endl;

            if (((double)rand() / (RAND_MAX)) > q.GetEpsilon())
            {
                //std::cout<<((double) rand() / (RAND_MAX)) <<std::endl;
                std::vector<float> vec = q._q_table[_observations];
                _action = arg_max(vec);
                //std::cout<<"action selected is "<<_action<<std::endl;
            }
            else
            {
                _action = (int)rand() % (q._actionSize) + 0;
                //std::cout<<"action selected is "<<_action<<std::endl;
                //std::cout<<"exit "<<((double) rand() / (RAND_MAX))<<std::endl;
            }
            player_pos = p.action(_action);
            //Play around with the reward function                                                //Player takes action in this stage
            double reward = 1 / ((player_pos.at(0) -  Player::_goal.at(0)) + (player_pos.at(1) -  Player::_goal.at(1)) + 0.001); //Assuming we had a vector with 2 states
            //std::cout<<reward<<std::endl;

            //std::cout << "New position " << player_pos.at(0) << " " << player_pos.at(1) << std::endl;

            if (player_pos.at(0) ==  Player::_goal.at(0) && player_pos.at(1) ==  Player::_goal.at(1))
            {
                std::cout << "Goal reached" << std::endl;
                break;
            }

            std::vector<int> new_obs;
            std::transform(player_pos.begin(), player_pos.end(), (Player::_goal).begin(), std::back_inserter(new_obs), std::minus<int>());
            //std::cout << "New Observation<<" << new_obs[0] << " " << new_obs[1] << " " << std::endl;

            std::vector<float> max_future;
            try
            {
                max_future = q._q_table[new_obs];
            }
            catch (const std::exception &er)
            {
                std::cout << "Error caught" << er.what() << std::endl;
            }
            std::vector<float>::iterator max_future_q;
            try
            {                                                                             //get all qvalues corresponding next best state
                max_future_q = max_element(std::begin(max_future), std::end(max_future)); // c++11
            }
            catch (const std::exception &er)
            {
                std::cout << "Error caught" << er.what() << std::endl;
            }
            //std::cout << "Observation<<" << _observations[0] << " " << _observations[1] << std::endl;
            //std::cout << "Action<<" << _action << std::endl;
            //std::cout<<q._q_table[_observations][_action]<<std::endl;
            float current_q;
            try
            {
                float current_q = q._q_table[_observations][_action];
            } //get the best qvalue corresponding next best state
            catch (const std::exception &er)
            {
                std::cout << "Error caught" << er.what() << std::endl;
            }
            //std::cout<<current_q<<std::endl;
            float new_q;
            try
            {
                float new_q = (1 - QLearning::_LEARNING_RATE) * current_q + QLearning::_LEARNING_RATE * (reward + QLearning::_DISCOUNT * (*max_future_q));
            }
            catch (const std::exception &er)
            {
                std::cout << "Error caught" << er.what() << std::endl;
            }

            try
            {
                q._q_table[_observations][_action] = new_q;
            }
            catch (const std::exception &er)
            {
                std::cout << "Error caught" << er.what() << std::endl;
            }
            episode_reward += reward;

            //
            //
            //
            //
        }

        float ep = q.GetEpsilon();
        std::cout << "#----------------------" << i << " Episode Reward: " << episode_reward << std::endl;
        q.SetEpsilon(ep * (QLearning::_EPS_DECAY)); //Epsilon Decay;
        //     // Read the image file

        Mat Picture(320, 240, CV_8UC3, cv::Scalar(0, 0, 0));
        // Check for failure
        if (Picture.empty())
        {
            std::cout << "Could not instantiate the image" << std::endl;
            std::cin.get(); //wait for any key press
        }

        resize(Picture, Picture, Size(500, 500));

        //A Parameters x (start in x axes horizontal) y (start in vertical)

        // w (vertical lenght)  h (Horizontal lenght)

        //Rect RectangleToDraw(2, 2, 100, 100);
        //Scaling by 20
        circle(Picture, Point(Player::_goal.at(0)*20, Player::_goal.at(1)*20), 20, Scalar(0, 255, 0), 2, 8, 0);

        Point p1 = Point(20 * p.x, 20 * p.y);
        circle(Picture, p1, 20, Scalar(255, 0, 255), -2, 8, 0);

        imshow("Path planner Reinforcement-Learning", Picture);
        waitKey(10);
        destroyWindow("Path planner Reinforcement-Learning");
    }
}